

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError Pa_IsStreamActive(PaStream *stream)

{
  PaError PVar1;
  
  if (initializationCount_ == 0) {
    return -10000;
  }
  if ((stream != (PaStream *)0x0) && (*stream == 0x18273645)) {
    PVar1 = (**(code **)(*(long *)((long)stream + 0x10) + 0x28))();
    return PVar1;
  }
  return -0x2704;
}

Assistant:

PaError Pa_IsStreamActive( PaStream *stream )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_IsStreamActive" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
        result = PA_STREAM_INTERFACE(stream)->IsActive( stream );


    PA_LOGAPI_EXIT_PAERROR( "Pa_IsStreamActive", result );

    return result;
}